

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
::emplace_new_key<slang::BufferID,unsigned_long>
          (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,BufferID *key,
          unsigned_long *args)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  uint32_t uVar4;
  long lVar5;
  unsigned_long uVar6;
  EntryPointer psVar7;
  EntryPointer psVar8;
  EntryPointer psVar9;
  sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
  sVar10;
  unsigned_long uVar11;
  size_t sVar12;
  uint32_t uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
  pVar16;
  pair<slang::BufferID,_unsigned_long> local_28;
  
  lVar5 = *(long *)(this + 0x10);
  if ((lVar5 != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
       )distance_from_desired)) {
    uVar11 = *(long *)(this + 0x20) + 1;
    auVar14._8_4_ = (int)(uVar11 >> 0x20);
    auVar14._0_8_ = uVar11;
    auVar14._12_4_ = 0x45300000;
    lVar1 = lVar5 + 1;
    auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar15._0_8_ = lVar1;
    auVar15._12_4_ = 0x45300000;
    if ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
      cVar3 = current_entry->distance_from_desired;
      if (cVar3 < '\0') {
        (current_entry->field_1).value.first.id = key->id;
        (current_entry->field_1).value.second = *args;
        current_entry->distance_from_desired = distance_from_desired;
        *(unsigned_long *)(this + 0x20) = uVar11;
      }
      else {
        uVar4 = key->id;
        uVar6 = *args;
        current_entry->distance_from_desired = distance_from_desired;
        uVar13 = (current_entry->field_1).value.first.id;
        (current_entry->field_1).value.first.id = uVar4;
        uVar11 = (current_entry->field_1).value.second;
        (current_entry->field_1).value.second = uVar6;
        sVar10 = (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
                  )(cVar3 + '\x01');
        cVar3 = current_entry[1].distance_from_desired;
        psVar9 = current_entry + 1;
        psVar8 = current_entry;
        while (psVar7 = psVar9, -1 < cVar3) {
          if (cVar3 < (char)sVar10) {
            psVar7->distance_from_desired = (int8_t)sVar10;
            uVar4 = (psVar7->field_1).value.first.id;
            (psVar7->field_1).value.first.id = uVar13;
            uVar6 = (psVar7->field_1).value.second;
            (psVar7->field_1).value.second = uVar11;
            sVar10 = (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
                      )(cVar3 + '\x01');
            uVar11 = uVar6;
            uVar13 = uVar4;
          }
          else {
            sVar10 = (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
                      )((char)sVar10 + '\x01');
            if (sVar10 == this[0x19]) {
              local_28.first.id = (current_entry->field_1).value.first.id;
              (current_entry->field_1).value.first.id = uVar13;
              local_28.second = (current_entry->field_1).value.second;
              (current_entry->field_1).value.second = uVar11;
              uVar2 = *(long *)(this + 0x10) * 2 + 2;
              sVar12 = 4;
              if (4 < uVar2) {
                sVar12 = uVar2;
              }
              sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
              ::rehash((sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
                        *)this,sVar12);
              pVar16 = emplace<std::pair<slang::BufferID,unsigned_long>>(this,&local_28);
              return pVar16;
            }
          }
          psVar9 = psVar7 + 1;
          psVar8 = psVar7;
          cVar3 = psVar7[1].distance_from_desired;
        }
        psVar8[1].field_1.value.first.id = uVar13;
        *(undefined4 *)((long)&psVar8[1].field_1 + 4) = local_28._4_4_;
        psVar8[1].field_1.value.second = uVar11;
        psVar7->distance_from_desired = (int8_t)sVar10;
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      }
      pVar16._9_7_ = (int7)(uVar11 >> 8);
      pVar16.second = true;
      pVar16.first.current = current_entry;
      return pVar16;
    }
  }
  uVar2 = lVar5 * 2 + 2;
  sVar12 = 4;
  if (4 < uVar2) {
    sVar12 = uVar2;
  }
  sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
  ::rehash((sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
            *)this,sVar12);
  pVar16 = emplace<slang::BufferID,unsigned_long>(this,key,args);
  return pVar16;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }